

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>::emplaceValue<QMakeInternal::QMakeBuiltin>
          (Node<ProKey,_QMakeInternal::QMakeBuiltin> *this,QMakeBuiltin *args)

{
  long lVar1;
  QMakeBuiltin *in_RDI;
  long in_FS_OFFSET;
  QMakeBuiltin *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMakeInternal::QMakeBuiltin::QMakeBuiltin(in_RDI,in_stack_ffffffffffffffa8);
  QMakeInternal::QMakeBuiltin::operator=(in_RDI,in_stack_ffffffffffffffa8);
  QMakeInternal::QMakeBuiltin::~QMakeBuiltin((QMakeBuiltin *)0x2dd70b);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }